

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O3

int Wln_ObjDup(Wln_Ntk_t *pNew,Wln_Ntk_t *p,int iObj)

{
  bool bVar1;
  int iObj_00;
  Wln_Vec_t *pWVar2;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar3;
  uint *puVar4;
  ulong uVar5;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  iObj_00 = Wln_ObjClone(pNew,p,iObj);
  lVar9 = (long)iObj;
  pWVar2 = p->vFanins;
  uVar5 = (ulong)(uint)pWVar2[lVar9].nSize;
  if (pWVar2[lVar9].nSize < 1) {
    bVar1 = false;
  }
  else {
    lVar10 = lVar9 * 0x10 + 8;
    lVar8 = 0;
    do {
      if ((int)uVar5 < 3) {
        puVar4 = (uint *)((long)&pWVar2->nCap + lVar10);
      }
      else {
        puVar4 = (uint *)(pWVar2[lVar9].field_2.pArray[0] + lVar8);
      }
      uVar7 = *puVar4;
      if ((ulong)uVar7 != 0) {
        if (((int)uVar7 < 0) || ((p->vCopies).nSize <= (int)uVar7)) goto LAB_0036201c;
        Wln_ObjAddFanin(pNew,iObj_00,(p->vCopies).pArray[uVar7]);
        pWVar2 = p->vFanins;
      }
      lVar8 = lVar8 + 1;
      uVar5 = (ulong)pWVar2[lVar9].nSize;
      lVar10 = lVar10 + 4;
    } while (lVar8 < (long)uVar5);
    bVar1 = 2 < pWVar2[lVar9].nSize;
  }
  if ((-1 < iObj) && (iObj < (p->vTypes).nSize)) {
    uVar7 = (p->vTypes).pArray[(uint)iObj] - 0x48;
    if (uVar7 < 0x1a) {
      if ((0x80023U >> (uVar7 & 0x1f) & 1) == 0) {
        if (uVar7 == 0x19) {
          paVar3 = &pWVar2[lVar9].field_2;
          if (bVar1) {
            paVar3 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar3->pArray[0];
          }
          Wln_ObjSetConst(pNew,iObj_00,paVar3->Array[0]);
        }
      }
      else {
        paVar3 = &pWVar2[lVar9].field_2;
        if (bVar1) {
          paVar3 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar3->pArray[0];
        }
        paVar6 = &pNew->vFanins[iObj_00].field_2;
        if (2 < pNew->vFanins[iObj_00].nSize) {
          paVar6 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar6->pArray[0];
        }
        paVar6->Array[1] = paVar3->Array[1];
      }
    }
    if (iObj < (p->vCopies).nSize) {
      (p->vCopies).pArray[(uint)iObj] = iObj_00;
      return iObj_00;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_0036201c:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Wln_ObjDup( Wln_Ntk_t * pNew, Wln_Ntk_t * p, int iObj )
{
    int i, iFanin, iObjNew = Wln_ObjClone( pNew, p, iObj );
    Wln_ObjForEachFanin( p, iObj, iFanin, i )
        Wln_ObjAddFanin( pNew, iObjNew, Wln_ObjCopy(p, iFanin) );
    if ( Wln_ObjIsConst(p, iObj) )
        Wln_ObjSetConst( pNew, iObjNew, Wln_ObjFanin0(p, iObj) );
    else if ( Wln_ObjIsSlice(p, iObj) || Wln_ObjIsRotate(p, iObj) || Wln_ObjIsTable(p, iObj) )
        Wln_ObjSetFanin( pNew, iObjNew, 1, Wln_ObjFanin1(p, iObj) );
    Wln_ObjSetCopy( p, iObj, iObjNew );
    return iObjNew;
}